

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# recalc.cpp
# Opt level: O3

void __thiscall Simplex::printTableau(Simplex *this,bool full)

{
  IndexVal **ppIVar1;
  int *piVar2;
  IndexVal *pIVar3;
  int iVar4;
  void *pvVar5;
  long lVar6;
  void *pvVar7;
  void *pvVar8;
  long lVar9;
  long lVar10;
  longdouble *a;
  long lVar11;
  ulong uVar12;
  ulong uVar13;
  uint uVar14;
  ulong uVar15;
  ulong uVar16;
  longdouble lVar17;
  
  calcRHS(this);
  lVar9 = (long)this->m + (long)this->n;
  uVar12 = lVar9 * 0x10;
  if ((int)lVar9 < 0) {
    uVar12 = 0xffffffffffffffff;
  }
  pvVar5 = operator_new__(uVar12);
  fwrite("Tableau:\n",9,1,_stderr);
  iVar4 = this->m + this->n;
  if (iVar4 != 0 && SCARRY4(this->m,this->n) == iVar4 < 0) {
    uVar12 = 0;
    do {
      fprintf(_stderr,"%d:%d ",uVar12 & 0xffffffff,(ulong)(uint)this->shift[uVar12]);
      uVar12 = uVar12 + 1;
    } while ((long)uVar12 < (long)this->m + (long)this->n);
  }
  fputc(10,_stderr);
  if (0 < this->m) {
    lVar9 = 0;
    do {
      calcBInvRow(this,(longdouble *)((long)this->n * 0x10 + (long)pvVar5),(int)lVar9);
      lVar6 = (long)this->n;
      if (0 < lVar6) {
        ppIVar1 = this->AV;
        piVar2 = this->AV_nz;
        lVar10 = 0;
        do {
          *(longdouble *)((long)pvVar5 + lVar10 * 0x10) = (longdouble)0;
          iVar4 = piVar2[lVar10];
          if (0 < (long)iVar4) {
            pIVar3 = ppIVar1[lVar10];
            lVar11 = 0;
            lVar17 = (longdouble)0;
            do {
              lVar17 = *(longdouble *)((long)&pIVar3->field_0 + lVar11) *
                       *(longdouble *)
                        ((long)pvVar5 +
                        (*(int *)((long)&pIVar3->field_0 + lVar11 + 0xc) + lVar6) * 0x10) + lVar17;
              *(longdouble *)(lVar10 * 0x10 + (long)pvVar5) = lVar17;
              lVar11 = lVar11 + 0x10;
            } while ((long)iVar4 * 0x10 != lVar11);
          }
          lVar10 = lVar10 + 1;
        } while (lVar10 != lVar6);
      }
      fprintf(_stderr,"%d: ",(ulong)(uint)this->rtoc[lVar9]);
      if ((full) && (iVar4 = this->m + this->n, iVar4 != 0 && SCARRY4(this->m,this->n) == iVar4 < 0)
         ) {
        uVar12 = 0;
        do {
          fprintf(_stderr,"%d:%.3Lf ",uVar12 & 0xffffffff);
          uVar12 = uVar12 + 1;
        } while ((long)uVar12 < (long)this->m + (long)this->n);
      }
      fprintf(_stderr,"rhs:%.18Lf");
      fputc(10,_stderr);
      lVar9 = lVar9 + 1;
    } while (lVar9 < this->m);
  }
  printObjective(this);
  fflush(_stderr);
  uVar14 = this->m;
  uVar15 = (ulong)uVar14;
  uVar13 = (long)this->n + (long)(int)uVar14;
  iVar4 = (int)uVar13;
  uVar12 = uVar13 * 8;
  if (iVar4 < 0) {
    uVar12 = 0xffffffffffffffff;
  }
  pvVar7 = operator_new__(uVar12);
  if (0 < iVar4) {
    uVar12 = (long)(int)uVar14 << 4;
    if ((int)uVar14 < 0) {
      uVar12 = 0xffffffffffffffff;
    }
    uVar16 = 0;
    do {
      pvVar8 = operator_new__(uVar12);
      *(void **)((long)pvVar7 + uVar16 * 8) = pvVar8;
      uVar16 = uVar16 + 1;
    } while ((uVar13 & 0xffffffff) != uVar16);
    if (0 < iVar4) {
      lVar9 = 0;
      do {
        if (0 < (int)uVar15) {
          lVar6 = *(long *)((long)pvVar7 + lVar9 * 8);
          lVar10 = 0;
          do {
            *(longdouble *)(lVar6 + lVar10) = (longdouble)0;
            lVar10 = lVar10 + 0x10;
          } while ((uVar15 & 0xffffffff) << 4 != lVar10);
        }
        iVar4 = this->AV_nz[lVar9];
        if ((long)iVar4 < 1) {
          a = *(longdouble **)((long)pvVar7 + lVar9 * 8);
        }
        else {
          pIVar3 = this->AV[lVar9];
          a = *(longdouble **)((long)pvVar7 + lVar9 * 8);
          lVar6 = 0;
          do {
            a[*(int *)((long)&pIVar3->field_0 + lVar6 + 0xc)] =
                 *(longdouble *)((long)&pIVar3->field_0 + lVar6);
            lVar6 = lVar6 + 0x10;
          } while ((long)iVar4 * 0x10 != lVar6);
        }
        Bmultiply(this,a);
        lVar9 = lVar9 + 1;
        uVar14 = this->m;
        uVar15 = (ulong)(int)uVar14;
      } while (lVar9 < (long)((long)this->n + uVar15));
    }
  }
  if (0 < (int)uVar14) {
    lVar9 = 0;
    do {
      fprintf(_stderr,"%d: ",(ulong)(uint)this->rtoc[lVar9]);
      iVar4 = this->m + this->n;
      if (iVar4 != 0 && SCARRY4(this->m,this->n) == iVar4 < 0) {
        uVar12 = 0;
        do {
          fprintf(_stderr,"%d:%.3Lf ",uVar12 & 0xffffffff);
          uVar12 = uVar12 + 1;
        } while ((long)uVar12 < (long)this->m + (long)this->n);
      }
      fputc(10,_stderr);
      lVar9 = lVar9 + 1;
    } while (lVar9 < this->m);
  }
  operator_delete__(pvVar5);
  iVar4 = this->m + this->n;
  if (iVar4 != 0 && SCARRY4(this->m,this->n) == iVar4 < 0) {
    lVar9 = 0;
    do {
      operator_delete(*(void **)((long)pvVar7 + lVar9 * 8));
      lVar9 = lVar9 + 1;
    } while (lVar9 < (long)this->m + (long)this->n);
  }
  operator_delete__(pvVar7);
  return;
}

Assistant:

void Simplex::printTableau(bool full) {
	calcRHS();
	//	long double row[n+m];
	auto* row = new long double[n + m];
	fprintf(stderr, "Tableau:\n");
	for (int i = 0; i < n + m; i++) {
		fprintf(stderr, "%d:%d ", i, shift[i]);
	}
	fprintf(stderr, "\n");
	for (int i = 0; i < m; i++) {
		calcBInvRow(&row[n], i);
		for (int j = 0; j < n; j++) {
			row[j] = 0;
			for (int k = 0; k < AV_nz[j]; k++) {
				row[j] += row[n + AV[j][k].index()] * AV[j][k].val();
			}
		}
		fprintf(stderr, "%d: ", rtoc[i]);
		if (full) {
			for (int j = 0; j < n + m; j++) {
				fprintf(stderr, "%d:%.3Lf ", j, row[j]);
			}
		}
		fprintf(stderr, "rhs:%.18Lf", rhs[i]);
		fprintf(stderr, "\n");
		//		row[rtoc[i]] -= 1;
		//		for (int j = 0; j < m; j++) {
		//			if (!almostZero6(row[rtoc[j]])) fprintf(stderr, "%d:%d:%.2Lf ", i, j, row[rtoc[j]]);
		//			assert(almostZero6(row[rtoc[j]]));
		//		}
	}
	printObjective();
	fflush(stderr);

	//	long double T[n+m][m];
	auto** T = new long double*[n + m];
	for (int i = 0; i < n + m; i++) {
		T[i] = new long double[m];
	}
	for (int i = 0; i < n + m; i++) {
		for (int j = 0; j < m; j++) {
			T[i][j] = 0;
		}
		for (int j = 0; j < AV_nz[i]; j++) {
			T[i][AV[i][j].index()] = AV[i][j].val();
		}
		Bmultiply(T[i]);
	}

	for (int i = 0; i < m; i++) {
		fprintf(stderr, "%d: ", rtoc[i]);
		for (int j = 0; j < n + m; j++) {
			fprintf(stderr, "%d:%.3Lf ", j, T[j][i]);
		}
		fprintf(stderr, "\n");
	}

	delete[] row;
	for (int i = 0; i < n + m; i++) {
		delete T[i];
	}
	delete[] T;
}